

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::d2star(Forth *this)

{
  uint valueLo;
  uint valueHi;
  anon_union_8_4_a234c5df_for_data_ local_18;
  DCell d1;
  Forth *this_local;
  
  d1.data_ = (anon_union_8_4_a234c5df_for_data_)this;
  requireDStackDepth(this,2,"D2*");
  valueLo = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell((DCell *)&local_18.Cells,valueLo,valueHi);
  local_18.Dcells = local_18.Dcells << 1;
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_18.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_18.Cells.hi);
  return;
}

Assistant:

void d2star(){
			REQUIRE_DSTACK_DEPTH(2, "D2*");
			DCell d1(dStack.getTop(1), dStack.getTop());
			d1.data_.Dcells <<= 1;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}